

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O0

bool __thiscall GoState<3U,_4U>::has_moves(GoState<3U,_4U> *this)

{
  bool bVar1;
  long *in_RDI;
  undefined1 local_20 [16];
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffff0;
  
  (**(code **)(*in_RDI + 0x60))(local_20);
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffff0);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffff0);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

virtual bool has_moves() const
	{
		// TODO: make faster.
		return ! get_moves().empty();
	}